

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calculateRootLogLikelihoods
          (BeagleCPUImpl<float,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int count,
          double *outSumLogLikelihood)

{
  double dVar1;
  _func_int **pp_Var2;
  double *pdVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  
  if (count != 1) {
    iVar5 = (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x4b])(this);
    return iVar5;
  }
  uVar4 = 0;
  if (-1 < (char)this->kFlags) {
    if (((uint)this->kFlags >> 8 & 1) == 0) {
      uVar4 = *cumulativeScaleIndices;
    }
    else {
      uVar4 = *bufferIndices - this->kTipCount;
    }
  }
  pp_Var2 = (this->super_BeagleImpl)._vptr_BeagleImpl;
  if (this->kAutoRootPartitioningEnabled == true) {
    (*pp_Var2[0x49])(this);
    *outSumLogLikelihood = 0.0;
    iVar5 = this->kPartitionCount;
    if (0 < (long)iVar5) {
      pdVar3 = this->gAutoPartitionOutSumLogLikelihoods;
      dVar1 = *outSumLogLikelihood;
      lVar6 = 0;
      do {
        dVar1 = dVar1 + pdVar3[lVar6];
        *outSumLogLikelihood = dVar1;
        lVar6 = lVar6 + 1;
      } while (iVar5 != lVar6);
    }
    return (uint)(!NAN(*outSumLogLikelihood) && !NAN(*outSumLogLikelihood)) * 8 + -8;
  }
  if (-1 < *categoryWeightsIndices) {
    iVar5 = (*pp_Var2[0x46])(this);
    return iVar5;
  }
  iVar5 = (*pp_Var2[0x47])(this,(ulong)(uint)*bufferIndices,(ulong)(uint)*stateFrequenciesIndices,
                           (ulong)uVar4,outSumLogLikelihood,pp_Var2[0x47]);
  return iVar5;
}

Assistant:

BEAGLE_CPU_TEMPLATE
    int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calculateRootLogLikelihoods(const int *bufferIndices,
                                                                       const int *categoryWeightsIndices,
                                                                       const int *stateFrequenciesIndices,
                                                                       const int *cumulativeScaleIndices,
                                                                       int count,
                                                                       double *outSumLogLikelihood) {

    if (count == 1) {
        // We treat this as a special case so that we don't have convoluted logic
        //      at the end of the loop over patterns
        int cumulativeScalingFactorIndex;
        if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
            cumulativeScalingFactorIndex = 0;
        } else if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
            cumulativeScalingFactorIndex = bufferIndices[0] - kTipCount;
        } else {
            cumulativeScalingFactorIndex = cumulativeScaleIndices[0];
        }

        if (kAutoRootPartitioningEnabled) {
            calcRootLogLikelihoodsByAutoPartitionAsync(bufferIndices,
                                                       categoryWeightsIndices,
                                                       stateFrequenciesIndices,
                                                       cumulativeScaleIndices,
                                                       gAutoPartitionIndices,
                                                       gAutoPartitionOutSumLogLikelihoods);

            *outSumLogLikelihood = 0.0;

            for (int i = 0; i < kPartitionCount; i++) {
                *outSumLogLikelihood += gAutoPartitionOutSumLogLikelihoods[i];
            }

            if (*outSumLogLikelihood != *outSumLogLikelihood) {
                return BEAGLE_ERROR_FLOATING_POINT;
            } else {
                return BEAGLE_SUCCESS;
            }
        } else {

            if (categoryWeightsIndices[0] >= 0) {
                return calcRootLogLikelihoods(bufferIndices[0], categoryWeightsIndices[0], stateFrequenciesIndices[0],
                                              cumulativeScalingFactorIndex, outSumLogLikelihood);
            } else {
                return calcRootLogLikelihoodsPerCategory(
                        bufferIndices[0], stateFrequenciesIndices[0], cumulativeScalingFactorIndex, outSumLogLikelihood);
            }
        }
    } else {
        return calcRootLogLikelihoodsMulti(bufferIndices, categoryWeightsIndices, stateFrequenciesIndices,
                                           cumulativeScaleIndices, count, outSumLogLikelihood);
    }
}